

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_compress_parallel_frames(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  LRWorkerData *pLVar1;
  uint8_t uVar2;
  AVxWorker *pAVar3;
  AV1_COMP *pAVar4;
  RestorationLineBuffers *pRVar5;
  bool bVar6;
  uint in_EAX;
  uint uVar7;
  int iVar8;
  AVxWorkerInterface *pAVar9;
  int in_ECX;
  int iVar10;
  SequenceHeader *pSVar11;
  ulong uVar12;
  aom_internal_error_info *src;
  long lVar13;
  bool bVar14;
  int ref_buffers_used_map;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  uVar7 = av1_init_parallel_frame_context(first_cpi_data,ppi,(int *)((long)&uStack_38 + 4));
  prepare_fpmt_workers(ppi,first_cpi_data,(AVxWorkerHook)(ulong)uVar7,in_ECX);
  pAVar9 = aom_get_worker_interface();
  lVar13 = (long)(ppi->p_mt_info).p_num_workers;
  if (0 < lVar13) {
    pAVar3 = (ppi->p_mt_info).p_workers[lVar13 + -1];
    for (; lVar13 != 1; lVar13 = lVar13 + -1) {
      (*pAVar9->launch)(pAVar3);
      pAVar3 = (ppi->p_mt_info).p_workers[lVar13 + -2];
    }
    (*pAVar9->execute)(pAVar3);
  }
  pAVar9 = aom_get_worker_interface();
  uVar12 = (ulong)(ppi->p_mt_info).p_num_workers;
  bVar6 = false;
  if ((long)uVar12 < 1) {
    bVar6 = true;
    src = (aom_internal_error_info *)0x0;
  }
  else {
    src = (aom_internal_error_info *)0x0;
    do {
      iVar8 = (*pAVar9->sync)((ppi->p_mt_info).p_workers[uVar12 - 1]);
      if (iVar8 == 0) {
        src = (ppi->parallel_cpi[uVar12 - 1]->common).error;
        bVar6 = true;
      }
      bVar14 = 1 < uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar14);
    bVar6 = !bVar6;
  }
  iVar8 = (ppi->p_mt_info).num_workers;
  if (0 < iVar8) {
    lVar13 = 0;
    iVar10 = 0;
    do {
      pAVar4 = ppi->parallel_cpi[lVar13];
      pSVar11 = (pAVar4->common).seq_params;
      if ((ppi->p_mt_info).cdef_worker != (AV1CdefWorkerData *)0x0) {
        uVar2 = pSVar11->monochrome;
        ((pAVar4->mt_info).cdef_worker)->srcbuf = (pAVar4->mt_info).restore_state_buf.cdef_srcbuf;
        uVar12 = 0;
        do {
          ((pAVar4->mt_info).cdef_worker)->colbuf[uVar12] =
               (pAVar4->mt_info).restore_state_buf.cdef_colbuf[uVar12];
          if (uVar2 != '\0') break;
          bVar14 = uVar12 < 2;
          uVar12 = uVar12 + 1;
        } while (bVar14);
        pSVar11 = (pAVar4->common).seq_params;
      }
      if (((pSVar11->enable_restoration != '\0') &&
          ((pAVar4->common).features.all_lossless == false)) &&
         ((pAVar4->common).tiles.large_scale == 0)) {
        pRVar5 = (pAVar4->mt_info).restore_state_buf.rlbs;
        pLVar1 = (pAVar4->mt_info).lr_row_sync.lrworkerdata +
                 ((pAVar4->mt_info).num_workers + iVar10 + -1);
        pLVar1->rst_tmpbuf = (pAVar4->mt_info).restore_state_buf.rst_tmpbuf;
        pLVar1->rlbs = pRVar5;
      }
      lVar13 = lVar13 + 1;
      iVar10 = iVar10 + (pAVar4->mt_info).num_workers;
    } while (iVar10 < iVar8);
  }
  if (!bVar6) {
    aom_internal_error_copy(&ppi->error,src);
  }
  if (0 < (int)uVar7) {
    uVar12 = 0;
    do {
      av1_release_scaled_references_fpmt(ppi->parallel_cpi[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar7 != uVar12);
  }
  av1_decrement_ref_counts_fpmt((ppi->cpi->common).buffer_pool,uStack_38._4_4_);
  return;
}

Assistant:

void av1_compress_parallel_frames(AV1_PRIMARY *const ppi,
                                  AV1_COMP_DATA *const first_cpi_data) {
  // Bitmask for the frame buffers referenced by cpi->scaled_ref_buf
  // corresponding to frames in the current parallel encode set.
  int ref_buffers_used_map = 0;
  int frames_in_parallel_set = av1_init_parallel_frame_context(
      first_cpi_data, ppi, &ref_buffers_used_map);
  prepare_fpmt_workers(ppi, first_cpi_data, get_compressed_data_hook,
                       frames_in_parallel_set);
  launch_fpmt_workers(ppi);
  sync_fpmt_workers(ppi, frames_in_parallel_set);

  // Release cpi->scaled_ref_buf corresponding to frames in the current parallel
  // encode set.
  for (int i = 0; i < frames_in_parallel_set; ++i) {
    av1_release_scaled_references_fpmt(ppi->parallel_cpi[i]);
  }
  av1_decrement_ref_counts_fpmt(ppi->cpi->common.buffer_pool,
                                ref_buffers_used_map);
}